

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaUint32 PaAlsaVersionNum(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__nptr;
  PaUint32 verNum;
  char *verStr;
  
  __nptr = (*alsa_snd_asoundlib_version)();
  iVar1 = atoi(__nptr);
  iVar2 = atoi(__nptr + 2);
  uVar3 = atoi(__nptr + 4);
  return iVar1 << 0x10 | iVar2 << 8 | uVar3;
}

Assistant:

static PaUint32 PaAlsaVersionNum(void)
{
    char* verStr;
    PaUint32 verNum;

    verStr = (char*) alsa_snd_asoundlib_version();
    verNum = ALSA_VERSION_INT( atoi(verStr), atoi(verStr + 2), atoi(verStr + 4) );
    PA_DEBUG(( "ALSA version (build): " SND_LIB_VERSION_STR "\nALSA version (runtime): %s\n", verStr ));

    return verNum;
}